

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ftp_disconnect(Curl_easy *data,connectdata *conn,_Bool dead_connection)

{
  byte *pbVar1;
  byte bVar2;
  CURLcode CVar3;
  char *pcVar4;
  undefined7 in_register_00000011;
  pingpong *pp;
  
  bVar2 = *(byte *)((long)&conn->proto + 0x112);
  if ((int)CONCAT71(in_register_00000011,dead_connection) == 0) {
    if ((bVar2 & 4) != 0) {
      CVar3 = Curl_pp_sendf(data,&(conn->proto).ftpc.pp,"%s","QUIT");
      if (CVar3 == CURLE_OK) {
        (data->conn->proto).ftpc.state = '\"';
        do {
          if ((conn->proto).ftpc.state == '\0') break;
          CVar3 = Curl_pp_statemach(data,&(conn->proto).ftpc.pp,true,true);
        } while (CVar3 == CURLE_OK);
      }
      else {
        pcVar4 = curl_easy_strerror(CVar3);
        Curl_failf(data,"Failure sending QUIT command: %s",pcVar4);
        pbVar1 = (byte *)((long)&conn->proto + 0x112);
        *pbVar1 = *pbVar1 & 0xfb;
        Curl_conncontrol(conn,1);
        (data->conn->proto).ftpc.state = '\0';
      }
    }
  }
  else {
    *(byte *)((long)&conn->proto + 0x112) = bVar2 & 0xfb;
  }
  pcVar4 = (conn->proto).ftpc.entrypath;
  if (pcVar4 != (char *)0x0) {
    if ((data->state).most_recent_ftp_entrypath == pcVar4) {
      (data->state).most_recent_ftp_entrypath = (char *)0x0;
    }
    (*Curl_cfree)(pcVar4);
    (conn->proto).ftpc.entrypath = (char *)0x0;
  }
  freedirs(&(conn->proto).ftpc);
  (*Curl_cfree)((conn->proto).ftpc.account);
  (conn->proto).ftpc.account = (char *)0x0;
  (*Curl_cfree)((conn->proto).ftpc.alternative_to_user);
  (conn->proto).ftpc.alternative_to_user = (char *)0x0;
  (*Curl_cfree)((conn->proto).ftpc.prevpath);
  (conn->proto).ftpc.prevpath = (char *)0x0;
  (*Curl_cfree)((conn->proto).ftpc.server_os);
  (conn->proto).ftpc.server_os = (char *)0x0;
  Curl_pp_disconnect(&(conn->proto).ftpc.pp);
  return CURLE_OK;
}

Assistant:

static CURLcode ftp_disconnect(struct Curl_easy *data,
                               struct connectdata *conn,
                               bool dead_connection)
{
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  struct pingpong *pp = &ftpc->pp;

  /* We cannot send quit unconditionally. If this connection is stale or
     bad in any way, sending quit and waiting around here will make the
     disconnect wait in vain and cause more problems than we need to.

     ftp_quit() will check the state of ftp->ctl_valid. If it's ok it
     will try to send the QUIT command, otherwise it will just return.
  */
  if(dead_connection)
    ftpc->ctl_valid = FALSE;

  /* The FTP session may or may not have been allocated/setup at this point! */
  (void)ftp_quit(data, conn); /* ignore errors on the QUIT */

  if(ftpc->entrypath) {
    if(data->state.most_recent_ftp_entrypath == ftpc->entrypath) {
      data->state.most_recent_ftp_entrypath = NULL;
    }
    Curl_safefree(ftpc->entrypath);
  }

  freedirs(ftpc);
  Curl_safefree(ftpc->account);
  Curl_safefree(ftpc->alternative_to_user);
  Curl_safefree(ftpc->prevpath);
  Curl_safefree(ftpc->server_os);
  Curl_pp_disconnect(pp);
  Curl_sec_end(conn);
  return CURLE_OK;
}